

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxlib.c
# Opt level: O0

int is_numeric(char *input)

{
  int iVar1;
  size_t sVar2;
  regmatch_t local_88;
  regmatch_t pmatch [3];
  undefined1 local_68 [8];
  regex_t regex;
  char *deb;
  int result;
  int rv;
  char *input_local;
  
  regex._56_8_ = 0;
  iVar1 = regcomp((regex_t *)local_68,"[+-]?[0-9]\\.?[0-9]*(e[+-]?[0-9]+)?",7);
  if (iVar1 == 0) {
    regex._56_8_ = deblank(input);
    iVar1 = regexec((regex_t *)local_68,(char *)regex._56_8_,3,&local_88,0);
    if (iVar1 == 0) {
      sVar2 = strlen((char *)regex._56_8_);
      input_local._4_4_ = (uint)(sVar2 == (long)(local_88.rm_eo - local_88.rm_so));
      regfree((regex_t *)local_68);
      free((void *)regex._56_8_);
    }
    else {
      input_local._4_4_ = 0;
    }
  }
  else {
    input_local._4_4_ = 0;
  }
  return input_local._4_4_;
}

Assistant:

int 
is_numeric(const char* input) 
{
	int rv;
	int result;
	char* deb = (char*)NULL;
	regex_t regex;
	regmatch_t pmatch[3];         // Up to 3 sub-expressions
	
	rv = regcomp(&regex, NUMERIC_MASK, REG_EXTENDED | REG_ICASE | REG_NEWLINE);
	if (rv) {
		return 0;
	}

	/* printf("input '%s'\n", input); */
	deb = deblank(input);
	
	/* printf("deb '%s'\n", deb); */
	rv = regexec(&regex, deb, ARRAY_SIZE (pmatch), pmatch, 0);
	
	if (rv) {
		return 0;
	}
	
	result = (int)
		(strlen(deb) == (size_t)(pmatch[0].rm_eo - pmatch[0].rm_so));
	
	regfree(&regex);
	free(deb);
	
	/* Normal function termination */
	return result; 
}